

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::C_DigestUpdate
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pPart,CK_ULONG ulPartLen)

{
  int iVar1;
  Session *this_00;
  HashAlgorithm *pHVar2;
  CK_RV CVar3;
  ByteString data;
  ByteString local_48;
  
  CVar3 = 400;
  if (this->isInitialised == true) {
    if (pPart == (CK_BYTE_PTR)0x0) {
      CVar3 = 7;
    }
    else {
      this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
      if (this_00 == (Session *)0x0) {
        CVar3 = 0xb3;
      }
      else {
        iVar1 = Session::getOpType(this_00);
        CVar3 = 0x91;
        if (iVar1 == 4) {
          ByteString::ByteString(&local_48,pPart,ulPartLen);
          pHVar2 = Session::getDigestOp(this_00);
          iVar1 = (*pHVar2->_vptr_HashAlgorithm[3])(pHVar2,&local_48);
          if ((char)iVar1 == '\0') {
            CVar3 = 5;
            Session::resetOp(this_00);
          }
          else {
            CVar3 = 0;
          }
          local_48._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
          std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                    (&local_48.byteString.
                      super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
        }
      }
    }
  }
  return CVar3;
}

Assistant:

CK_RV SoftHSM::C_DigestUpdate(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pPart, CK_ULONG ulPartLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pPart == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_DIGEST) return CKR_OPERATION_NOT_INITIALIZED;

	// Get the data
	ByteString data(pPart, ulPartLen);

	// Digest the data
	if (session->getDigestOp()->hashUpdate(data) == false)
	{
		session->resetOp();
		return CKR_GENERAL_ERROR;
	}

	return CKR_OK;
}